

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testExtendByBox<Imath_3_2::Vec3<long>>(char *type)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  size_type sVar7;
  reference v;
  long *plVar8;
  long *__b;
  char *in_RDI;
  float fVar9;
  uint k_1;
  uint k;
  Vec3<long> p1_1;
  Vec3<long> p0_1;
  uint i_1;
  Vec3<long> max;
  Vec3<long> min;
  Box<Imath_3_2::Vec3<long>_> b_1;
  uint iters;
  Rand32 rand;
  Box<Imath_3_2::Vec3<long>_> b1;
  Box<Imath_3_2::Vec3<long>_> b0;
  Vec3<long> p1;
  Vec3<long> p0;
  uint j;
  uint i;
  vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> perms;
  Box<Imath_3_2::Vec3<long>_> b;
  float in_stack_fffffffffffffce8;
  float in_stack_fffffffffffffcec;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  Vec3<long> *in_stack_fffffffffffffcf8;
  Box<Imath_3_2::Vec3<long>_> *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd30;
  undefined2 in_stack_fffffffffffffd34;
  undefined1 in_stack_fffffffffffffd36;
  undefined1 in_stack_fffffffffffffd37;
  bool bVar10;
  bool local_299;
  uint local_268;
  uint local_264;
  Vec3<long> local_260;
  Vec3<long> local_248;
  uint local_22c;
  Vec3<long> local_228;
  Vec3<long> local_210;
  Vec3<long> local_1f8;
  Vec3<long> VStack_1e0;
  undefined4 local_1c4;
  Vec3<long> local_188;
  Vec3<long> aVStack_170 [3];
  Vec3<long> local_128;
  Vec3<long> VStack_110;
  Vec3<long> local_f8;
  Vec3<long> local_e0;
  uint local_c4;
  uint local_c0;
  vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> local_b0;
  Vec3<long> local_98;
  Vec3<long> local_80 [3];
  Vec3<long> local_38;
  Vec3<long> VStack_20;
  char *local_8;
  
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"    extendBy() box for type ");
  poVar4 = std::operator<<(poVar4,local_8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Box<Imath_3_2::Vec3<long>_>::Box
            ((Box<Imath_3_2::Vec3<long>_> *)
             CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
  Imath_3_2::Box<Imath_3_2::Vec3<long>_>::Box
            ((Box<Imath_3_2::Vec3<long>_> *)
             CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
  Imath_3_2::Box<Imath_3_2::Vec3<long>_>::extendBy
            ((Box<Imath_3_2::Vec3<long>_> *)
             CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
             (Box<Imath_3_2::Vec3<long>_> *)
             CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  lVar5 = Imath_3_2::Vec3<long>::baseTypeMax();
  Imath_3_2::Vec3<long>::Vec3(local_80,lVar5);
  bVar1 = Imath_3_2::Vec3<long>::operator==(&local_38,local_80);
  local_299 = false;
  if (bVar1) {
    lVar5 = Imath_3_2::Vec3<long>::baseTypeLowest();
    Imath_3_2::Vec3<long>::Vec3(&local_98,lVar5);
    local_299 = Imath_3_2::Vec3<long>::operator==(&VStack_20,&local_98);
  }
  if (local_299 == false) {
    __assert_fail("b.min == T (T::baseTypeMax ()) && b.max == T (T::baseTypeLowest ())",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,300,
                  "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec3<long>]"
                 );
  }
  std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::vector
            ((vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> *)0x11602c);
  permutations<Imath_3_2::Vec3<long>>
            ((vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> *)
             CONCAT17(in_stack_fffffffffffffd37,
                      CONCAT16(in_stack_fffffffffffffd36,
                               CONCAT24(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30))));
  local_c0 = 0;
  do {
    uVar6 = (ulong)local_c0;
    sVar7 = std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::size
                      (&local_b0);
    if (sVar7 <= uVar6) {
      std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::~vector
                ((vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> *)
                 in_stack_fffffffffffffd00);
      Imath_3_2::Rand32::Rand32
                ((Rand32 *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                 CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      local_1c4 = 10;
      Imath_3_2::Box<Imath_3_2::Vec3<long>_>::Box
                ((Box<Imath_3_2::Vec3<long>_> *)
                 CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
      Imath_3_2::Vec3<long>::Vec3(&local_210);
      Imath_3_2::Vec3<long>::Vec3(&local_228);
      local_22c = 1;
      while( true ) {
        if (9 < local_22c) {
          return;
        }
        Imath_3_2::Vec3<long>::Vec3(&local_248);
        Imath_3_2::Vec3<long>::Vec3(&local_260);
        local_264 = 0;
        while (uVar3 = local_264, uVar2 = Imath_3_2::Vec3<long>::dimensions(), uVar3 < uVar2) {
          fVar9 = Imath_3_2::Rand32::nextf
                            ((Rand32 *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0)
                             ,in_stack_fffffffffffffcec,in_stack_fffffffffffffce8);
          plVar8 = Imath_3_2::Vec3<long>::operator[](&local_248,local_264);
          *plVar8 = (long)fVar9;
          fVar9 = Imath_3_2::Rand32::nextf
                            ((Rand32 *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0)
                             ,in_stack_fffffffffffffcec,in_stack_fffffffffffffce8);
          plVar8 = Imath_3_2::Vec3<long>::operator[](&local_260,local_264);
          *plVar8 = (long)fVar9;
          local_264 = local_264 + 1;
        }
        Imath_3_2::Vec3<long>::operator=(&local_210,&local_1f8);
        Imath_3_2::Vec3<long>::operator=(&local_228,&VStack_1e0);
        for (local_268 = 0; uVar3 = Imath_3_2::Vec3<long>::dimensions(), local_268 < uVar3;
            local_268 = local_268 + 1) {
          in_stack_fffffffffffffcf8 =
               (Vec3<long> *)Imath_3_2::Vec3<long>::operator[](&local_210,local_268);
          plVar8 = Imath_3_2::Vec3<long>::operator[](&local_248,local_268);
          plVar8 = std::min<long>(&in_stack_fffffffffffffcf8->x,plVar8);
          in_stack_fffffffffffffd00 = (Box<Imath_3_2::Vec3<long>_> *)*plVar8;
          plVar8 = Imath_3_2::Vec3<long>::operator[](&local_210,local_268);
          *plVar8 = (long)in_stack_fffffffffffffd00;
          plVar8 = Imath_3_2::Vec3<long>::operator[](&local_228,local_268);
          __b = Imath_3_2::Vec3<long>::operator[](&local_260,local_268);
          plVar8 = std::max<long>(plVar8,__b);
          lVar5 = *plVar8;
          plVar8 = Imath_3_2::Vec3<long>::operator[](&local_228,local_268);
          *plVar8 = lVar5;
        }
        Imath_3_2::Box<Imath_3_2::Vec3<long>_>::Box
                  (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                   (Vec3<long> *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
        Imath_3_2::Box<Imath_3_2::Vec3<long>_>::extendBy
                  ((Box<Imath_3_2::Vec3<long>_> *)
                   CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                   (Box<Imath_3_2::Vec3<long>_> *)
                   CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        bVar1 = Imath_3_2::Vec3<long>::operator==(&local_1f8,&local_210);
        in_stack_fffffffffffffcf7 = false;
        if (bVar1) {
          in_stack_fffffffffffffcf7 = Imath_3_2::Vec3<long>::operator==(&VStack_1e0,&local_228);
        }
        if ((bool)in_stack_fffffffffffffcf7 == false) break;
        local_22c = local_22c + 1;
      }
      __assert_fail("b.min == min && b.max == max",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                    ,0x165,
                    "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec3<long>]"
                   );
    }
    for (local_c4 = 0; uVar6 = (ulong)local_c4,
        sVar7 = std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::size
                          (&local_b0), uVar6 < sVar7; local_c4 = local_c4 + 1) {
      std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::operator[]
                (&local_b0,(ulong)local_c0);
      Imath_3_2::Vec3<long>::operator-
                ((Vec3<long> *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      v = std::vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::operator[]
                    (&local_b0,(ulong)local_c4);
      Imath_3_2::Vec3<long>::Vec3(&local_f8,v);
      Imath_3_2::Box<Imath_3_2::Vec3<long>_>::Box
                ((Box<Imath_3_2::Vec3<long>_> *)
                 CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
      Imath_3_2::Box<Imath_3_2::Vec3<long>_>::Box
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                 (Vec3<long> *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
      Imath_3_2::Box<Imath_3_2::Vec3<long>_>::extendBy
                ((Box<Imath_3_2::Vec3<long>_> *)
                 CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                 (Box<Imath_3_2::Vec3<long>_> *)
                 CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      bVar1 = Imath_3_2::Vec3<long>::operator==(&local_128,&local_e0);
      bVar10 = false;
      if (bVar1) {
        bVar10 = Imath_3_2::Vec3<long>::operator==(&VStack_110,&local_f8);
      }
      if (bVar10 == false) {
        __assert_fail("b0.min == p0 && b0.max == p1",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                      ,0x13f,
                      "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec3<long>]"
                     );
      }
      Imath_3_2::Box<Imath_3_2::Vec3<long>_>::Box
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                 (Vec3<long> *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
      Imath_3_2::Box<Imath_3_2::Vec3<long>_>::Box
                ((Box<Imath_3_2::Vec3<long>_> *)
                 CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
      Imath_3_2::Box<Imath_3_2::Vec3<long>_>::extendBy
                ((Box<Imath_3_2::Vec3<long>_> *)
                 CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                 (Box<Imath_3_2::Vec3<long>_> *)
                 CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      bVar1 = Imath_3_2::Vec3<long>::operator==(&local_188,&local_e0);
      bVar10 = false;
      if (bVar1) {
        bVar10 = Imath_3_2::Vec3<long>::operator==(aVStack_170,&local_f8);
      }
      if (bVar10 == false) {
        __assert_fail("b1.min == p0 && b1.max == p1",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                      ,0x143,
                      "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec3<long>]"
                     );
      }
    }
    local_c0 = local_c0 + 1;
  } while( true );
}

Assistant:

void
testExtendByBox (const char* type)
{
    cout << "    extendBy() box for type " << type << endl;

    //
    // Extend empty box with an empty box;
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        b.extendBy (IMATH_INTERNAL_NAMESPACE::Box<T> ());
        assert (
            b.min == T (T::baseTypeMax ()) &&
            b.max == T (T::baseTypeLowest ()));
    }

    //
    // Extend empty box with a non-empty box and vice versa.
    //
    {
        std::vector<T> perms;
        permutations (perms);

        for (unsigned int i = 0; i < perms.size (); i++)
        {
            for (unsigned int j = 0; j < perms.size (); j++)
            {
                T p0 = -perms[i];
                T p1 = perms[j];

                IMATH_INTERNAL_NAMESPACE::Box<T> b0;
                b0.extendBy (IMATH_INTERNAL_NAMESPACE::Box<T> (p0, p1));
                assert (b0.min == p0 && b0.max == p1);

                IMATH_INTERNAL_NAMESPACE::Box<T> b1 (p0, p1);
                b1.extendBy (IMATH_INTERNAL_NAMESPACE::Box<T> ());
                assert (b1.min == p0 && b1.max == p1);
            }
        }
    }

    //
    // Extend non-empty box with non-empty box. Starts with empty, then builds.
    //
    IMATH_INTERNAL_NAMESPACE::Rand32 rand (0);
    const unsigned int               iters = 10;
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;

        T min, max;

        for (unsigned int i = 1; i < iters; i++)
        {
            T p0;
            T p1;
            for (unsigned int k = 0; k < T::dimensions (); k++)
            {
                p0[k] = typename T::BaseType (rand.nextf (0, 999));
                p1[k] = typename T::BaseType (rand.nextf (1000, 1999));
            }

            min = b.min;
            max = b.max;
            for (unsigned int k = 0; k < T::dimensions (); k++)
            {
                min[k] = std::min (min[k], p0[k]);
                max[k] = std::max (max[k], p1[k]);
            }
            b.extendBy (IMATH_INTERNAL_NAMESPACE::Box<T> (p0, p1));

            assert (b.min == min && b.max == max);
        }
    }
}